

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::AssertionInstanceExpression::serializeTo
          (AssertionInstanceExpression *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppSVar2;
  long lVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "symbol";
  name._M_len = 6;
  ASTSerializer::writeLink(serializer,name,this->symbol);
  ASTSerializer::write(serializer,4,"body",(size_t)this->body);
  ASTSerializer::write(serializer,0x13,"isRecursiveProperty",(ulong)this->isRecursiveProperty);
  name_00._M_str = "localVars";
  name_00._M_len = 9;
  ASTSerializer::startArray(serializer,name_00);
  sVar1 = (this->localVars)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppSVar2 = (this->localVars)._M_ptr;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Symbol **)((long)ppSVar2 + lVar3),false);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void AssertionInstanceExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("symbol", symbol);
    serializer.write("body", body);
    serializer.write("isRecursiveProperty", isRecursiveProperty);

    serializer.startArray("localVars");
    for (auto var : localVars)
        serializer.serialize(*var);
    serializer.endArray();
}